

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd128.c
# Opt level: O2

int rmd128_init(hash_state *md)

{
  if (md == (hash_state *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd128.c",0x110);
  }
  (md->rmd128).state[3] = 0x10325476;
  (md->sha3).s[8] = 0x6745230100000000;
  (md->sha3).s[9] = 0x98badcfeefcdab89;
  (md->chc).length = 0;
  return 0;
}

Assistant:

int rmd128_init(hash_state * md)
{
   LTC_ARGCHK(md != NULL);
   md->rmd128.state[0] = 0x67452301UL;
   md->rmd128.state[1] = 0xefcdab89UL;
   md->rmd128.state[2] = 0x98badcfeUL;
   md->rmd128.state[3] = 0x10325476UL;
   md->rmd128.curlen   = 0;
   md->rmd128.length   = 0;
   return CRYPT_OK;
}